

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

JsValueRef
Debugger::GetProperties
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsErrorCode jsErrorCode_3;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  int totalCount;
  int fromCount;
  int objectHandle;
  JsValueRef properties;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  _fromCount = (JsValueRef)0x0;
  if (3 < argumentCount) {
    properties = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    JVar1 = ChakraRTInterface::JsNumberToInt(arguments[1],&totalCount);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    JVar1 = ChakraRTInterface::JsNumberToInt(ppvStack_28[2],(int *)&jsErrorCode);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[2], &fromCount) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    JVar1 = ChakraRTInterface::JsNumberToInt(ppvStack_28[3],(int *)&jsErrorCode_1);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[3], &totalCount) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    JVar1 = ChakraRTInterface::JsDiagGetProperties
                      (totalCount,jsErrorCode,jsErrorCode_1,(JsValueRef *)&fromCount);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsDiagGetProperties(objectHandle, fromCount, totalCount, &properties) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
  }
  return _fromCount;
}

Assistant:

JsValueRef Debugger::GetProperties(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsValueRef properties = JS_INVALID_REFERENCE;
    int objectHandle;
    int fromCount;
    int totalCount;

    if (argumentCount > 3)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[2], &fromCount));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[3], &totalCount));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagGetProperties(objectHandle, fromCount, totalCount, &properties));
    }

    return properties;
}